

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::blitFramebuffer
          (ReferenceContext *this,int srcX0,int srcY0,int srcX1,int srcY1,int dstX0,int dstY0,
          int dstX1,int dstY1,deUint32 mask,deUint32 filter)

{
  TextureFormat format;
  bool bVar1;
  byte bVar2;
  int iVar3;
  TextureChannelClass TVar4;
  uint uVar5;
  int yo_1;
  int iVar6;
  int xo;
  int iVar7;
  int xo_2;
  int yo;
  int iVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  IVec4 dstRect;
  IVec4 srcRect;
  PixelBufferAccess dst;
  ConstPixelBufferAccess src;
  MultisampleConstPixelBufferAccess src_1;
  Vec4 p;
  Mat3 transform;
  Vector<float,_3> local_50;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  
  iVar8 = dstY1 - dstY0;
  dstRect.m_data[1] = dstY0;
  if (dstY1 < dstY0) {
    dstRect.m_data[1] = dstY1;
  }
  iVar9 = dstX1 - dstX0;
  dstRect.m_data[0] = dstX0;
  if (dstX1 < dstX0) {
    dstRect.m_data[0] = dstX1;
  }
  iVar6 = srcY1 - srcY0;
  srcRect.m_data[1] = srcY0;
  if (srcY1 < srcY0) {
    srcRect.m_data[1] = srcY1;
  }
  iVar7 = srcX1 - srcX0;
  srcRect.m_data[0] = srcX0;
  if (srcX1 < srcX0) {
    srcRect.m_data[0] = srcX1;
  }
  srcRect.m_data[2] = -iVar7;
  if (0 < iVar7) {
    srcRect.m_data[2] = iVar7;
  }
  srcRect.m_data[3] = -iVar6;
  if (0 < iVar6) {
    srcRect.m_data[3] = iVar6;
  }
  dstRect.m_data[2] = -iVar9;
  if (0 < iVar9) {
    dstRect.m_data[2] = iVar9;
  }
  dstRect.m_data[3] = -iVar8;
  if (0 < iVar8) {
    dstRect.m_data[3] = iVar8;
  }
  bVar10 = srcRect.m_data[3] != dstRect.m_data[3] || srcRect.m_data[2] != dstRect.m_data[2];
  if (filter - 0x2602 < 0xfffffffe) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if ((mask & 0x500) != 0 && filter != 0x2600) goto LAB_01526bb3;
  iVar3 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca9);
  if (((iVar3 != 0x8cd5) ||
      (iVar3 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca8), iVar3 != 0x8cd5)) ||
     (getDrawColorbuffer((MultisamplePixelBufferAccess *)&src_1,this),
     src_1.m_access.m_size.m_data[0] != 1)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,this);
  if (src_1.m_access.m_size.m_data[0] != 1) {
    if (bVar10) goto LAB_01526bb3;
    if ((mask & 0x4000) != 0) {
      getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,this);
      getDrawColorbuffer((MultisamplePixelBufferAccess *)&src,this);
      if (src_1.m_access.m_format.order != src.m_format.order) goto LAB_0152755a;
      if (src_1.m_access.m_format.type != src.m_format.type) goto LAB_0152755a;
    }
    if ((mask >> 8 & 1) != 0) {
      getReadDepthbuffer((MultisamplePixelBufferAccess *)&src_1,this);
      getDrawDepthbuffer((MultisamplePixelBufferAccess *)&src,this);
      if (src_1.m_access.m_format.order != src.m_format.order) {
LAB_0152755a:
        if (this->m_lastError == 0) {
          this->m_lastError = 0x502;
        }
        return;
      }
      if (src_1.m_access.m_format.type != src.m_format.type) goto LAB_0152755a;
    }
    if ((mask >> 10 & 1) != 0) {
      getReadStencilbuffer((MultisamplePixelBufferAccess *)&src_1,this);
      getDrawStencilbuffer((MultisamplePixelBufferAccess *)&src,this);
      if (src_1.m_access.m_format.order == src.m_format.order) {
        if (src_1.m_access.m_format.type == src.m_format.type) goto LAB_01526c62;
      }
LAB_01526bb3:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
  }
LAB_01526c62:
  uVar5 = mask & 0x4000;
  if (uVar5 == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&dst,&srcRect);
  }
  else {
    getReadColorbuffer((MultisamplePixelBufferAccess *)&src,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&src);
    p.m_data[0] = 0.0;
    p.m_data[1] = 0.0;
    p.m_data[3] = (float)src_1.m_access.m_size.m_data[2];
    p.m_data[2] = (float)src_1.m_access.m_size.m_data[1];
    intersect(&srcRect,(IVec4 *)&p);
  }
  if ((mask >> 8 & 1) == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&dst,&srcRect);
  }
  else {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)&src,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&src);
    p.m_data[0] = 0.0;
    p.m_data[1] = 0.0;
    p.m_data[3] = (float)src_1.m_access.m_size.m_data[2];
    p.m_data[2] = (float)src_1.m_access.m_size.m_data[1];
    intersect(&srcRect,(IVec4 *)&p);
  }
  if ((mask >> 10 & 1) == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&dst,&srcRect);
  }
  else {
    getReadStencilbuffer((MultisamplePixelBufferAccess *)&src,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&src);
    p.m_data[0] = 0.0;
    p.m_data[1] = 0.0;
    p.m_data[3] = (float)src_1.m_access.m_size.m_data[2];
    p.m_data[2] = (float)src_1.m_access.m_size.m_data[1];
    intersect(&srcRect,(IVec4 *)&p);
  }
  srcRect.m_data[1] = dst.super_ConstPixelBufferAccess.m_format.type;
  srcRect.m_data[0] = dst.super_ConstPixelBufferAccess.m_format.order;
  srcRect.m_data[3] = dst.super_ConstPixelBufferAccess.m_size.m_data[1];
  srcRect.m_data[2] = dst.super_ConstPixelBufferAccess.m_size.m_data[0];
  if (uVar5 == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&dst,&dstRect);
  }
  else {
    getDrawColorbuffer((MultisamplePixelBufferAccess *)&src,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&src);
    p.m_data[0] = 0.0;
    p.m_data[1] = 0.0;
    p.m_data[3] = (float)src_1.m_access.m_size.m_data[2];
    p.m_data[2] = (float)src_1.m_access.m_size.m_data[1];
    intersect(&dstRect,(IVec4 *)&p);
  }
  if ((mask >> 8 & 1) == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&dst,&dstRect);
  }
  else {
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&src,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&src);
    p.m_data[0] = 0.0;
    p.m_data[1] = 0.0;
    p.m_data[3] = (float)src_1.m_access.m_size.m_data[2];
    p.m_data[2] = (float)src_1.m_access.m_size.m_data[1];
    intersect(&dstRect,(IVec4 *)&p);
  }
  if ((mask >> 10 & 1) == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&dst,&dstRect);
  }
  else {
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&src,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&src);
    p.m_data[0] = 0.0;
    p.m_data[1] = 0.0;
    p.m_data[3] = (float)src_1.m_access.m_size.m_data[2];
    p.m_data[2] = (float)src_1.m_access.m_size.m_data[1];
    intersect(&dstRect,(IVec4 *)&p);
  }
  if (this->m_scissorEnabled == true) {
    intersect(&dstRect,&this->m_scissorBox);
  }
  else {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&src_1,&dstRect);
  }
  dstRect.m_data[2] = src_1.m_access.m_size.m_data[0];
  dstRect.m_data[3] = src_1.m_access.m_size.m_data[1];
  dstRect.m_data[0] = src_1.m_access.m_format.order;
  dstRect.m_data[1] = src_1.m_access.m_format.type;
  if (srcRect.m_data[2] == 0) {
    return;
  }
  if (srcRect.m_data[3] == 0) {
    return;
  }
  if (src_1.m_access.m_size.m_data[0] == 0) {
    return;
  }
  if (src_1.m_access.m_size.m_data[1] == 0) {
    return;
  }
  getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,this);
  if (src_1.m_access.m_size.m_data[0] == 1) {
    local_38.m_data[0] = (float)(srcX0 - srcRect.m_data[0]);
    local_38.m_data[1] = (float)(srcY0 - srcRect.m_data[1]);
    tcu::translationMatrix<float,_2>((Matrix<float,_3,_3> *)&src,&local_38);
    local_50.m_data[1] = (float)iVar6 / (float)iVar8;
    local_50.m_data[0] = (float)iVar7 / (float)iVar9;
    local_50.m_data[2] = 1.0;
    tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)&dst,&local_50);
    tcu::operator*((Matrix<float,_3,_3> *)&src_1,(Matrix<float,_3,_3> *)&src,
                   (Matrix<float,_3,_3> *)&dst);
    local_40.m_data[0] = (float)(dstRect.m_data[0] - dstX0);
    local_40.m_data[1] = (float)(dstRect.m_data[1] - dstY0);
    tcu::translationMatrix<float,_2>((Matrix<float,_3,_3> *)&p,&local_40);
    tcu::operator*(&transform,(Matrix<float,_3,_3> *)&src_1,(Matrix<float,_3,_3> *)&p);
    if (uVar5 != 0) {
      getReadColorbuffer((MultisamplePixelBufferAccess *)&p,this);
      rr::MultisamplePixelBufferAccess::toSinglesampleAccess
                (&dst,(MultisamplePixelBufferAccess *)&p);
      tcu::getSubregion((PixelBufferAccess *)&src_1,&dst,srcRect.m_data[0],srcRect.m_data[1],
                        srcRect.m_data[2],srcRect.m_data[3]);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&src,&src_1.m_access);
      getDrawColorbuffer((MultisamplePixelBufferAccess *)&p,this);
      rr::MultisamplePixelBufferAccess::toSinglesampleAccess
                ((PixelBufferAccess *)&src_1,(MultisamplePixelBufferAccess *)&p);
      tcu::getSubregion(&dst,(PixelBufferAccess *)&src_1,dstRect.m_data[0],dstRect.m_data[1],
                        dstRect.m_data[2],dstRect.m_data[3]);
      TVar4 = tcu::getTextureChannelClass(dst.super_ConstPixelBufferAccess.m_format.type);
      src_1.m_access.m_format.order = R;
      src_1.m_access.m_format.type = SNORM_INT8;
      src_1.m_access.m_size.m_data[0] = 0;
      src_1.m_access.m_size.m_data[1] = (int)(filter == 0x2601 && bVar10);
      src_1.m_access.m_pitch.m_data[0] = 0;
      src_1.m_access.m_pitch.m_data[1]._0_1_ = 0;
      src_1.m_access._28_8_ = 0;
      src_1.m_access.m_data._4_1_ = 0;
      stack0xffffffffffffff45 = 0;
      src_1.m_access.m_size.m_data[2] = src_1.m_access.m_size.m_data[1];
      bVar10 = tcu::isSRGB(src.m_format);
      format.type = dst.super_ConstPixelBufferAccess.m_format.type;
      format.order = dst.super_ConstPixelBufferAccess.m_format.order;
      bVar1 = tcu::isSRGB(format);
      if ((this->m_sRGBUpdateEnabled == true) &&
         (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0)) {
        bVar2 = 1;
      }
      else {
        local_50.m_data._0_8_ = toNonSRGBFormat(&src.m_format);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&p,(TextureFormat *)&local_50,src.m_size.m_data[0],
                   src.m_size.m_data[1],src.m_size.m_data[2],src.m_pitch.m_data[1],
                   src.m_pitch.m_data[2],src.m_data);
        src.m_format.order = (ChannelOrder)p.m_data[0];
        src.m_format.type = (ChannelType)p.m_data[1];
        src.m_size.m_data[0] = (int)p.m_data[2];
        src.m_size.m_data[1] = (int)p.m_data[3];
        local_50.m_data._0_8_ = toNonSRGBFormat((TextureFormat *)&dst);
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&p,(TextureFormat *)&local_50,
                   dst.super_ConstPixelBufferAccess.m_size.m_data[0],
                   dst.super_ConstPixelBufferAccess.m_size.m_data[1],
                   dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                   dst.super_ConstPixelBufferAccess.m_pitch.m_data[1],
                   dst.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                   dst.super_ConstPixelBufferAccess.m_data);
        dst.super_ConstPixelBufferAccess.m_format.order = (ChannelOrder)p.m_data[0];
        dst.super_ConstPixelBufferAccess.m_format.type = (ChannelType)p.m_data[1];
        dst.super_ConstPixelBufferAccess.m_size.m_data[0] = (int)p.m_data[2];
        dst.super_ConstPixelBufferAccess.m_size.m_data[1] = (int)p.m_data[3];
        bVar2 = 0;
      }
      for (iVar8 = 0; iVar8 < dstRect.m_data[3]; iVar8 = iVar8 + 1) {
        for (iVar9 = 0; iVar9 < dstRect.m_data[2]; iVar9 = iVar9 + 1) {
          fVar11 = transform.m_data.m_data[0].m_data[0] * ((float)iVar9 + 0.5) +
                   transform.m_data.m_data[1].m_data[0] * ((float)iVar8 + 0.5) +
                   transform.m_data.m_data[2].m_data[0];
          if (((0.0 <= fVar11) && (fVar11 < (float)srcRect.m_data[2])) &&
             ((fVar12 = ((float)iVar9 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                        transform.m_data.m_data[1].m_data[1] * ((float)iVar8 + 0.5) +
                        transform.m_data.m_data[2].m_data[1], 0.0 <= fVar12 &&
              (fVar12 < (float)srcRect.m_data[3])))) {
            if ((TVar4 < TEXTURECHANNELCLASS_LAST & 0x13U >> ((byte)TVar4 & 0x1f)) == 0 && !bVar10)
            {
              fVar11 = floorf(fVar11);
              fVar12 = floorf(fVar12);
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&p,(int)&src,(int)fVar11,(int)fVar12);
              tcu::PixelBufferAccess::setPixel(&dst,(IVec4 *)&p,iVar9,iVar8,0);
            }
            else {
              tcu::ConstPixelBufferAccess::sample2D
                        ((ConstPixelBufferAccess *)&p,(Sampler *)&src,(FilterMode)&src_1,fVar11,
                         fVar12,src_1.m_access.m_size.m_data[1]);
              if ((bVar1 & bVar2) == 0) {
                tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_50,(Vector<float,_4> *)&p);
              }
              else {
                tcu::linearToSRGB((tcu *)&local_50,&p);
              }
              tcu::PixelBufferAccess::setPixel(&dst,(Vec4 *)&local_50,iVar9,iVar8,0);
            }
          }
        }
      }
    }
    if (((mask >> 8 & 1) != 0) && (this->m_depthMask == true)) {
      getReadDepthbuffer((MultisamplePixelBufferAccess *)&p,this);
      rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p,
                       srcRect.m_data[0],srcRect.m_data[1],srcRect.m_data[2],srcRect.m_data[3]);
      getDepthMultisampleAccess
                ((MultisamplePixelBufferAccess *)&src,(MultisamplePixelBufferAccess *)&dst);
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                (&src_1,(MultisamplePixelBufferAccess *)&src);
      getDrawDepthbuffer((MultisamplePixelBufferAccess *)&p,this);
      rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p,
                       dstRect.m_data[0],dstRect.m_data[1],dstRect.m_data[2],dstRect.m_data[3]);
      getDepthMultisampleAccess
                ((MultisamplePixelBufferAccess *)&src,(MultisamplePixelBufferAccess *)&dst);
      for (iVar8 = 0; iVar8 < dstRect.m_data[3]; iVar8 = iVar8 + 1) {
        for (iVar9 = 0; iVar9 < dstRect.m_data[2]; iVar9 = iVar9 + 1) {
          fVar11 = floorf(transform.m_data.m_data[0].m_data[0] * ((float)iVar9 + 0.5) +
                          transform.m_data.m_data[1].m_data[0] * ((float)iVar8 + 0.5) +
                          transform.m_data.m_data[2].m_data[0]);
          fVar12 = floorf(((float)iVar9 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                          transform.m_data.m_data[1].m_data[1] * ((float)iVar8 + 0.5) +
                          transform.m_data.m_data[2].m_data[1]);
          fVar11 = tcu::ConstPixelBufferAccess::getPixDepth
                             (&src_1.m_access,0,(int)fVar11,(int)fVar12);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)&src,fVar11,0,iVar9,iVar8);
        }
      }
    }
    if ((mask >> 10 & 1) == 0) {
      return;
    }
    getReadStencilbuffer((MultisamplePixelBufferAccess *)&p,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p,
                     srcRect.m_data[0],srcRect.m_data[1],srcRect.m_data[2],srcRect.m_data[3]);
    getStencilMultisampleAccess
              ((MultisamplePixelBufferAccess *)&src,(MultisamplePixelBufferAccess *)&dst);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&src);
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&p,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p,
                     dstRect.m_data[0],dstRect.m_data[1],dstRect.m_data[2],dstRect.m_data[3]);
    getStencilMultisampleAccess
              ((MultisamplePixelBufferAccess *)&src,(MultisamplePixelBufferAccess *)&dst);
    for (iVar8 = 0; iVar8 < dstRect.m_data[3]; iVar8 = iVar8 + 1) {
      for (iVar9 = 0; iVar9 < dstRect.m_data[2]; iVar9 = iVar9 + 1) {
        fVar12 = ((float)iVar9 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                 transform.m_data.m_data[1].m_data[1] * ((float)iVar8 + 0.5) +
                 transform.m_data.m_data[2].m_data[1];
        fVar11 = floorf(transform.m_data.m_data[0].m_data[0] * ((float)iVar9 + 0.5) +
                        transform.m_data.m_data[1].m_data[0] * ((float)iVar8 + 0.5) +
                        transform.m_data.m_data[2].m_data[0]);
        floorf(fVar12);
        tcu::ConstPixelBufferAccess::getPixelUint
                  (&dst.super_ConstPixelBufferAccess,(int)&src_1,0,(int)fVar11);
        writeMaskedStencil((MultisamplePixelBufferAccess *)&src,0,iVar9,iVar8,
                           dst.super_ConstPixelBufferAccess.m_format.order,
                           this->m_stencil[0].writeMask);
      }
    }
    return;
  }
  blitResolveMultisampleFramebuffer
            (this,mask,&srcRect,&dstRect,srcX1 < srcX0 != dstX1 < dstX0,
             srcY1 < srcY0 != dstY1 < dstY0);
  return;
}

Assistant:

void ReferenceContext::blitFramebuffer (int srcX0, int srcY0, int srcX1, int srcY1, int dstX0, int dstY0, int dstX1, int dstY1, deUint32 mask, deUint32 filter)
{
	// p0 in inclusive, p1 exclusive.
	// Negative width/height means swap.
	bool	swapSrcX	= srcX1 < srcX0;
	bool	swapSrcY	= srcY1 < srcY0;
	bool	swapDstX	= dstX1 < dstX0;
	bool	swapDstY	= dstY1 < dstY0;
	int		srcW		= de::abs(srcX1-srcX0);
	int		srcH		= de::abs(srcY1-srcY0);
	int		dstW		= de::abs(dstX1-dstX0);
	int		dstH		= de::abs(dstY1-dstY0);
	bool	scale		= srcW != dstW || srcH != dstH;
	int		srcOriginX	= swapSrcX ? srcX1 : srcX0;
	int		srcOriginY	= swapSrcY ? srcY1 : srcY0;
	int		dstOriginX	= swapDstX ? dstX1 : dstX0;
	int		dstOriginY	= swapDstY ? dstY1 : dstY0;
	IVec4	srcRect		= IVec4(srcOriginX, srcOriginY, srcW, srcH);
	IVec4	dstRect		= IVec4(dstOriginX, dstOriginY, dstW, dstH);

	RC_IF_ERROR(filter != GL_NEAREST && filter != GL_LINEAR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((mask & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0 && filter != GL_NEAREST, GL_INVALID_OPERATION, RC_RET_VOID);

	// Validate that both targets are complete.
	RC_IF_ERROR(checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE ||
				checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check samples count is valid
	RC_IF_ERROR(getDrawColorbuffer().getNumSamples() != 1, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check size restrictions of multisampled case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		// Src and Dst rect dimensions must be the same
		RC_IF_ERROR(srcW != dstW || srcH != dstH, GL_INVALID_OPERATION, RC_RET_VOID);

		// Framebuffer formats must match
		if (mask & GL_COLOR_BUFFER_BIT)		RC_IF_ERROR(getReadColorbuffer().raw().getFormat()   != getDrawColorbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_DEPTH_BUFFER_BIT)		RC_IF_ERROR(getReadDepthbuffer().raw().getFormat()   != getDrawDepthbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_STENCIL_BUFFER_BIT)	RC_IF_ERROR(getReadStencilbuffer().raw().getFormat() != getDrawStencilbuffer().raw().getFormat(), GL_INVALID_OPERATION, RC_RET_VOID);
	}

	// Compute actual source rect.
	srcRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadColorbuffer()))	: srcRect;
	srcRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadDepthbuffer()))	: srcRect;
	srcRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(srcRect, getBufferRect(getReadStencilbuffer()))	: srcRect;

	// Compute destination rect.
	dstRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawColorbuffer()))	: dstRect;
	dstRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawDepthbuffer()))	: dstRect;
	dstRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(dstRect, getBufferRect(getDrawStencilbuffer()))	: dstRect;
	dstRect = m_scissorEnabled					? intersect(dstRect, m_scissorBox)							: dstRect;

	if (isEmpty(srcRect) || isEmpty(dstRect))
		return; // Don't attempt copy.

	// Multisampled read buffer is a special case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		deUint32 error = blitResolveMultisampleFramebuffer(mask, srcRect, dstRect, swapSrcX ^ swapDstX, swapSrcY ^ swapDstY);

		if (error != GL_NO_ERROR)
			setError(error);

		return;
	}

	// \note Multisample pixel buffers can now be accessed like non-multisampled because multisample read buffer case is already handled. => sample count must be 1

	// Coordinate transformation:
	// Dst offset space -> dst rectangle space -> src rectangle space -> src offset space.
	tcu::Mat3 transform = tcu::translationMatrix(Vec2((float)(srcX0 - srcRect.x()), (float)(srcY0 - srcRect.y())))
						* tcu::Mat3(Vec3((float)(srcX1-srcX0) / (float)(dstX1-dstX0),
										 (float)(srcY1-srcY0) / (float)(dstY1-dstY0),
										 1.0f))
						* tcu::translationMatrix(Vec2((float)(dstRect.x() - dstX0), (float)(dstRect.y() - dstY0)));

	if (mask & GL_COLOR_BUFFER_BIT)
	{
		tcu::ConstPixelBufferAccess		src			= tcu::getSubregion(getReadColorbuffer().toSinglesampleAccess(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		tcu::PixelBufferAccess			dst			= tcu::getSubregion(getDrawColorbuffer().toSinglesampleAccess(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());
		tcu::TextureChannelClass		dstClass	= tcu::getTextureChannelClass(dst.getFormat().type);
		bool							dstIsFloat	= dstClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT		||
													  dstClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
													  dstClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		tcu::Sampler::FilterMode		sFilter		= (scale && filter == GL_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;
		tcu::Sampler					sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
													 sFilter, sFilter, 0.0f /* lod threshold */, false /* non-normalized coords */);
		bool							srcIsSRGB	= tcu::isSRGB(src.getFormat());
		bool							dstIsSRGB	= tcu::isSRGB(dst.getFormat());
		const bool						convertSRGB	= m_sRGBUpdateEnabled && glu::isContextTypeES(getType());

		if (!convertSRGB)
		{
			src	= tcu::ConstPixelBufferAccess	(toNonSRGBFormat(src.getFormat()), src.getWidth(), src.getHeight(), src.getDepth(), src.getRowPitch(), src.getSlicePitch(), src.getDataPtr());
			dst	= tcu::PixelBufferAccess		(toNonSRGBFormat(dst.getFormat()), dst.getWidth(), dst.getHeight(), dst.getDepth(), dst.getRowPitch(), dst.getSlicePitch(), dst.getDataPtr());
		}

		// \note We don't check for unsupported conversions, unlike spec requires.

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;

				// \note Only affine part is used.
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				// do not copy pixels outside the modified source region (modified by buffer intersection)
				if (sX < 0.0f || sX >= (float)srcRect.z() ||
					sY < 0.0f || sY >= (float)srcRect.w())
					continue;

				if (dstIsFloat || srcIsSRGB || filter == tcu::Sampler::LINEAR)
				{
					Vec4 p = src.sample2D(sampler, sampler.minFilter, sX, sY, 0);
					dst.setPixel((dstIsSRGB && convertSRGB) ? tcu::linearToSRGB(p) : p, xo, yo);
				}
				else
					dst.setPixel(src.getPixelInt(deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)), xo, yo);
			}
		}
	}

	if ((mask & GL_DEPTH_BUFFER_BIT) && m_depthMask)
	{
		rr::MultisampleConstPixelBufferAccess	src		= getDepthMultisampleAccess(rr::getSubregion(getReadDepthbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst		= getDepthMultisampleAccess(rr::getSubregion(getDrawDepthbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int sampleNdx = 0; // multisample read buffer case is already handled

				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				writeDepthOnly(dst, sampleNdx, xo, yo, src.raw().getPixDepth(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)));
			}
		}
	}

	if (mask & GL_STENCIL_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= getStencilMultisampleAccess(rr::getSubregion(getReadStencilbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst	= getStencilMultisampleAccess(rr::getSubregion(getDrawStencilbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int	sampleNdx = 0; // multisample read buffer case is already handled

				float		dX			= (float)xo + 0.5f;
				float		dY			= (float)yo + 0.5f;
				float		sX			= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float		sY			= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);
				deUint32	srcStencil	= src.raw().getPixelUint(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)).x();

				writeMaskedStencil(dst, sampleNdx, xo, yo, srcStencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
			}
		}
	}
}